

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O0

void export_residual_table_to_string
               (double *residuals,double *header,double *left_column,uint time_steps,
               uint space_steps,char *result)

{
  size_t sVar1;
  uint uStack_20040;
  uint uStack_2003c;
  uint space_step;
  uint time_step;
  char current_experiment_to_string [131072];
  char *result_local;
  uint space_steps_local;
  uint time_steps_local;
  double *left_column_local;
  double *header_local;
  double *residuals_local;
  
  memset(&space_step,0,0x20000);
  for (uStack_20040 = 0; uStack_20040 < space_steps; uStack_20040 = uStack_20040 + 1) {
    snprintf((char *)&space_step,0x20000,"%.6lf",header[uStack_20040]);
    sVar1 = strlen(result);
    strncat(result,(char *)&space_step,0x1ffff - sVar1);
  }
  for (uStack_20040 = 0; uStack_20040 < space_steps; uStack_20040 = uStack_20040 + 1) {
    snprintf((char *)&space_step,0x20000,"%.6lf",left_column[uStack_20040]);
    sVar1 = strlen(result);
    strncat(result,(char *)&space_step,0x1ffff - sVar1);
    for (uStack_2003c = 0; uStack_2003c < time_steps; uStack_2003c = uStack_2003c + 1) {
      snprintf((char *)&space_step,0x20000,"%le",residuals[uStack_20040 * time_steps + uStack_2003c]
              );
      sVar1 = strlen(result);
      strncat(result,(char *)&space_step,0x1ffff - sVar1);
    }
    snprintf((char *)&space_step,0x20000,"%s","\n");
    sVar1 = strlen(result);
    strncat(result,(char *)&space_step,0x1ffff - sVar1);
  }
  return;
}

Assistant:

void export_residual_table_to_string (double const * residuals, 
                            double const * header, 
                            double const * left_column,
                            unsigned const time_steps, 
                            unsigned const space_steps,
                            char * result) {
  // result is output string

  char current_experiment_to_string[MAX_BUFFER_SIZE] = "";
  unsigned time_step, space_step;

  for (space_step = 0; space_step < space_steps; ++space_step) {
    snprintf (current_experiment_to_string, 
            MAX_BUFFER_SIZE,
            "%.6lf",
            header[space_step]);
    strncat (result, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result) - 1);
  }

  for (space_step = 0; space_step < space_steps; ++space_step) {
    snprintf (current_experiment_to_string, 
              MAX_BUFFER_SIZE,
              "%.6lf",
              left_column[space_step]);
    strncat (result, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result) - 1);

    for (time_step = 0; time_step < time_steps; ++time_step) {
      snprintf (current_experiment_to_string, 
              MAX_BUFFER_SIZE,
              "%le",
              residuals[space_step * time_steps + time_step]);
      strncat (result, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result) - 1);
    }

    snprintf (current_experiment_to_string, 
              MAX_BUFFER_SIZE,
              "%s",
              "\n");
    strncat (result, current_experiment_to_string,
             MAX_BUFFER_SIZE - strlen(result) - 1);
  }

  return;
}